

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::OperatorSubtractFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  ScalarFunctionSet *in_RDI;
  element_type *type;
  LogicalType local_d38;
  LogicalType local_d20;
  string local_d08;
  ScalarFunction local_ce8;
  ScalarFunction local_bc0;
  ScalarFunction local_a98;
  ScalarFunction local_970;
  ScalarFunction local_848;
  ScalarFunction local_720;
  ScalarFunction local_5f8;
  ScalarFunction local_4d0;
  ScalarFunction local_3a8;
  ScalarFunction local_280;
  ScalarFunction local_158;
  
  ::std::__cxx11::string::string((string *)&local_d08,"-",(allocator *)&local_d38);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_d08);
  ::std::__cxx11::string::~string((string *)&local_d08);
  LogicalType::Numeric();
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  for (type = (element_type *)local_d38._0_8_;
      type != local_d38.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      type = (element_type *)&(type->alias)._M_string_length) {
    SubtractFunction::GetFunction(&local_158,(LogicalType *)type);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               &local_158);
    ScalarFunction::~ScalarFunction(&local_158);
    SubtractFunction::GetFunction(&local_280,(LogicalType *)type,(LogicalType *)type);
    ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
    emplace_back<duckdb::ScalarFunction>
              (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
               &local_280);
    ScalarFunction::~ScalarFunction(&local_280);
  }
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_d38);
  LogicalType::LogicalType(&local_d38,DATE);
  LogicalType::LogicalType(&local_d20,DATE);
  SubtractFunction::GetFunction(&local_3a8,&local_d38,&local_d20);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_3a8);
  ScalarFunction::~ScalarFunction(&local_3a8);
  LogicalType::~LogicalType(&local_d20);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::LogicalType(&local_d38,DATE);
  LogicalType::LogicalType(&local_d20,INTEGER);
  SubtractFunction::GetFunction(&local_4d0,&local_d38,&local_d20);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_4d0);
  ScalarFunction::~ScalarFunction(&local_4d0);
  LogicalType::~LogicalType(&local_d20);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::LogicalType(&local_d38,TIMESTAMP);
  LogicalType::LogicalType(&local_d20,TIMESTAMP);
  SubtractFunction::GetFunction(&local_5f8,&local_d38,&local_d20);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_5f8);
  ScalarFunction::~ScalarFunction(&local_5f8);
  LogicalType::~LogicalType(&local_d20);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::LogicalType(&local_d38,INTERVAL);
  LogicalType::LogicalType(&local_d20,INTERVAL);
  SubtractFunction::GetFunction(&local_720,&local_d38,&local_d20);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_720);
  ScalarFunction::~ScalarFunction(&local_720);
  LogicalType::~LogicalType(&local_d20);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::LogicalType(&local_d38,DATE);
  LogicalType::LogicalType(&local_d20,INTERVAL);
  SubtractFunction::GetFunction(&local_848,&local_d38,&local_d20);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_848);
  ScalarFunction::~ScalarFunction(&local_848);
  LogicalType::~LogicalType(&local_d20);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::LogicalType(&local_d38,TIME);
  LogicalType::LogicalType(&local_d20,INTERVAL);
  SubtractFunction::GetFunction(&local_970,&local_d38,&local_d20);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_970);
  ScalarFunction::~ScalarFunction(&local_970);
  LogicalType::~LogicalType(&local_d20);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::LogicalType(&local_d38,TIMESTAMP);
  LogicalType::LogicalType(&local_d20,INTERVAL);
  SubtractFunction::GetFunction(&local_a98,&local_d38,&local_d20);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_a98);
  ScalarFunction::~ScalarFunction(&local_a98);
  LogicalType::~LogicalType(&local_d20);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::LogicalType(&local_d38,TIME_TZ);
  LogicalType::LogicalType(&local_d20,INTERVAL);
  SubtractFunction::GetFunction(&local_bc0,&local_d38,&local_d20);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_bc0);
  ScalarFunction::~ScalarFunction(&local_bc0);
  LogicalType::~LogicalType(&local_d20);
  LogicalType::~LogicalType(&local_d38);
  LogicalType::LogicalType(&local_d38,INTERVAL);
  SubtractFunction::GetFunction(&local_ce8,&local_d38);
  ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            (&this->super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
             &local_ce8);
  ScalarFunction::~ScalarFunction(&local_ce8);
  LogicalType::~LogicalType(&local_d38);
  return in_RDI;
}

Assistant:

ScalarFunctionSet OperatorSubtractFun::GetFunctions() {
	ScalarFunctionSet subtract("-");
	for (auto &type : LogicalType::Numeric()) {
		// unary subtract function, negates the input (i.e. multiplies by -1)
		subtract.AddFunction(SubtractFunction::GetFunction(type));
		// binary subtract function "a - b", subtracts b from a
		subtract.AddFunction(SubtractFunction::GetFunction(type, type));
	}
	// we can subtract dates from each other
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::DATE, LogicalType::DATE));
	// we can subtract integers from dates
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::DATE, LogicalType::INTEGER));
	// we can subtract timestamps from each other
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::TIMESTAMP, LogicalType::TIMESTAMP));
	// we can subtract intervals from each other
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::INTERVAL, LogicalType::INTERVAL));
	// we can subtract intervals from dates/times/timestamps, but not the other way around
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::DATE, LogicalType::INTERVAL));
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::TIME, LogicalType::INTERVAL));
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::TIMESTAMP, LogicalType::INTERVAL));
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::TIME_TZ, LogicalType::INTERVAL));
	// we can negate intervals
	subtract.AddFunction(SubtractFunction::GetFunction(LogicalType::INTERVAL));

	return subtract;
}